

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O1

example * VW::alloc_examples(size_t param_1,size_t count)

{
  example *peVar1;
  uint64_t *puVar2;
  
  peVar1 = calloc_or_throw<example>(count);
  if (peVar1 == (example *)0x0) {
    peVar1 = (example *)0x0;
  }
  else if (count != 0) {
    puVar2 = &(peVar1->super_example_predict).ft_offset;
    do {
      *(undefined1 *)((long)puVar2 + 0xab) = 1;
      *puVar2 = 0;
      puVar2 = puVar2 + 0xd1a;
      count = count - 1;
    } while (count != 0);
  }
  return peVar1;
}

Assistant:

example* alloc_examples(size_t, size_t count = 1)
{
  example* ec = calloc_or_throw<example>(count);
  if (ec == nullptr)
    return nullptr;
  for (size_t i = 0; i < count; i++)
  {
    ec[i].in_use = true;
    ec[i].ft_offset = 0;
    //  std::cerr << "  alloc_example.indices.begin()=" << ec->indices.begin() << " end=" << ec->indices.end() << " //
    //  ld = " << ec->ld << "\t|| me = " << ec << std::endl;
  }
  return ec;
}